

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TextTrieMap::putImpl(TextTrieMap *this,UnicodeString *key,void *value,UErrorCode *status)

{
  CharacterNode *pCVar1;
  UnicodeString *this_00;
  int32_t *piVar2;
  undefined2 uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  UnicodeString foldedKey;
  UnicodeString local_70;
  
  if (this->fNodes == (CharacterNode *)0x0) {
    this->fNodesCapacity = 0x200;
    pCVar1 = (CharacterNode *)uprv_malloc_63(0x2000);
    this->fNodes = pCVar1;
    if (pCVar1 == (CharacterNode *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    pCVar1->fValues = (void *)0x0;
    pCVar1->fCharacter = L'\0';
    pCVar1->fFirstChild = 0;
    pCVar1->fNextSibling = 0;
    pCVar1->fHasValuesVector = '\0';
    pCVar1->fPadding = '\0';
    this->fNodesCount = 1;
  }
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e6fd8;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  if (this->fIgnoreCase == '\0') {
    piVar2 = &(key->fUnion).fFields.fLength;
    uVar3 = (key->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar3 & 0x11) == 0) {
      if ((uVar3 & 2) == 0) {
        uVar6 = (key->fUnion).fFields.fArray;
      }
      else {
        uVar6 = (key->fUnion).fStackFields.fBuffer;
      }
      goto LAB_002035f6;
    }
  }
  else {
    this_00 = UnicodeString::fastCopyFrom(&local_70,key);
    UnicodeString::foldCase(this_00,0);
    piVar2 = &local_70.fUnion.fFields.fLength;
    uVar3 = local_70.fUnion.fStackFields.fLengthAndFlags;
    if ((local_70.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
      uVar6 = local_70.fUnion.fFields.fArray;
      if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        uVar6 = local_70.fUnion.fStackFields.fBuffer;
      }
      goto LAB_002035f6;
    }
  }
  uVar6 = (char16_t *)0x0;
LAB_002035f6:
  if ((short)uVar3 < 0) {
    uVar4 = *piVar2;
  }
  else {
    uVar4 = (int)(short)uVar3 >> 5;
  }
  pCVar1 = this->fNodes;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pCVar1 = addChildNode(this,pCVar1,*(char16_t *)(uVar6 + uVar5 * 2),status);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  CharacterNode::addValue(pCVar1,value,this->fValueDeleter,status);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
TextTrieMap::putImpl(const UnicodeString &key, void *value, UErrorCode &status) {
    if (fNodes == NULL) {
        fNodesCapacity = 512;
        fNodes = (CharacterNode *)uprv_malloc(fNodesCapacity * sizeof(CharacterNode));
        if (fNodes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        fNodes[0].clear();  // Init root node.
        fNodesCount = 1;
    }

    UnicodeString foldedKey;
    const UChar *keyBuffer;
    int32_t keyLength;
    if (fIgnoreCase) {
        // Ok to use fastCopyFrom() because we discard the copy when we return.
        foldedKey.fastCopyFrom(key).foldCase();
        keyBuffer = foldedKey.getBuffer();
        keyLength = foldedKey.length();
    } else {
        keyBuffer = key.getBuffer();
        keyLength = key.length();
    }

    CharacterNode *node = fNodes;
    int32_t index;
    for (index = 0; index < keyLength; ++index) {
        node = addChildNode(node, keyBuffer[index], status);
    }
    node->addValue(value, fValueDeleter, status);
}